

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O1

DefaultInitVec<uint8_t> * readInto(DefaultInitVec<uint8_t> *__return_storage_ptr__,path *path)

{
  int iVar1;
  undefined4 extraout_var;
  pointer puVar2;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  pbVar3;
  long lVar4;
  size_type sVar5;
  int *piVar6;
  char *pcVar7;
  size_type __new_size;
  size_type sVar8;
  long lVar9;
  size_type sVar10;
  File file;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  local_150;
  Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
  local_130;
  _Variadic_union<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  local_128;
  undefined1 local_38;
  
  local_128._M_first._M_storage =
       (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
       (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
  local_38 = 0;
  iVar1 = File::open((File *)&local_128._M_first,(char *)path,0xc);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_130.super_anon_class_8_1_89901123.path =
         (anon_class_8_1_89901123)(anon_class_8_1_89901123)path;
    std::
    visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
              (&local_150,&local_130,
               (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                *)&local_128._M_first);
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    fatal("Failed to open \"%s\": %s",local_150._M_dataplus._M_p,pcVar7);
  }
  (__return_storage_ptr__->
  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (pointer)operator_new(0x800);
  (__return_storage_ptr__->
  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = puVar2;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = puVar2 + 0x800;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = puVar2 + 0x800;
  sVar10 = 0;
  do {
    sVar8 = (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                             *)&local_150,
                            (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                             *)&local_128._M_first);
    lVar9 = sVar8 - sVar10;
    lVar4 = (**(code **)(*(long *)pbVar3 + 0x40))
                      (pbVar3,(__return_storage_ptr__->
                              super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + sVar10,lVar9);
    if (lVar4 == lVar9) {
      sVar5 = (long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      __new_size = sVar10 * 2;
      if (sVar10 != sVar5) {
        __new_size = sVar5;
      }
      if (sVar10 == __new_size) {
        __assert_fail("oldSize != newSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                      ,0x31,"readInto");
      }
      std::
      vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::resize(__return_storage_ptr__,__new_size);
    }
    else {
      std::
      vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::resize(__return_storage_ptr__,sVar10 + lVar4);
    }
    sVar10 = sVar8;
    if (lVar4 != lVar9) {
      File::~File((File *)&local_128._M_first);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static DefaultInitVec<uint8_t> readInto(std::filesystem::path path) {
	File file;
	if (!file.open(path, std::ios::in | std::ios::binary)) {
		fatal("Failed to open \"%s\": %s", file.string(path).c_str(), strerror(errno));
	}
	DefaultInitVec<uint8_t> data(128 * 16); // Begin with some room pre-allocated

	size_t curSize = 0;
	for (;;) {
		size_t oldSize = curSize;
		curSize = data.size();

		// Fill the new area ([oldSize; curSize[) with bytes
		size_t nbRead =
		    file->sgetn(reinterpret_cast<char *>(&data.data()[oldSize]), curSize - oldSize);
		if (nbRead != curSize - oldSize) {
			// Shrink the vector to discard bytes that weren't read
			data.resize(oldSize + nbRead);
			break;
		}
		// If the vector has some capacity left, use it; otherwise, double the current size

		// Arbitrary, but if you got a better idea...
		size_t newSize = oldSize != data.capacity() ? data.capacity() : oldSize * 2;
		assert(oldSize != newSize);
		data.resize(newSize);
	}

	return data;
}